

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase130::run(TestCase130 *this)

{
  bool bVar1;
  char *pcVar2;
  StringPtr needle;
  StringPtr needle_00;
  StringPtr needle_01;
  StringPtr needle_02;
  StringPtr needle_03;
  StringPtr needle_04;
  StringPtr needle_05;
  StringPtr needle_06;
  StringPtr needle_07;
  StringPtr needle_08;
  StringPtr needle_09;
  StringPtr needle_10;
  StringPtr needle_11;
  StringPtr needle_12;
  StringPtr needle_13;
  StringPtr needle_14;
  StringPtr haystack;
  StringPtr haystack_00;
  StringPtr haystack_01;
  StringPtr haystack_02;
  StringPtr haystack_03;
  StringPtr haystack_04;
  StringPtr haystack_05;
  StringPtr haystack_06;
  StringPtr haystack_07;
  StringPtr haystack_08;
  StringPtr haystack_09;
  StringPtr haystack_10;
  StringPtr haystack_11;
  StringPtr haystack_12;
  StringPtr haystack_13;
  StringPtr haystack_14;
  NullableValue<kj::Exception> e;
  Runnable local_2e0 [2];
  char local_2d0;
  Exception local_2c8;
  char *local_170;
  undefined1 local_168 [344];
  
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458b70;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle.content.size_ = 0x17;
    needle.content.ptr = "invalid path component";
    haystack.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack,needle);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[86],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x83,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"invalid path component\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [86])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"invalid path component\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x83,ERROR,"\"code did not throw: \" \"Path(\\\"\\\")\"",
               (char (*) [29])"code did not throw: Path(\"\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458ba0;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_00.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_00.content.size_ = 0x17;
    needle_00.content.ptr = "invalid path component";
    haystack_00.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_00,needle_00);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[86],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x84,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"invalid path component\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [86])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"invalid path component\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x84,ERROR,"\"code did not throw: \" \"Path(\\\".\\\")\"",
               (char (*) [30])"code did not throw: Path(\".\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458bd0;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_01.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_01.content.size_ = 0x17;
    needle_01.content.ptr = "invalid path component";
    haystack_01.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_01,needle_01);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[86],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x85,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"invalid path component\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [86])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"invalid path component\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x85,ERROR,"\"code did not throw: \" \"Path(\\\"..\\\")\"",
               (char (*) [31])"code did not throw: Path(\"..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458c00;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_02.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_02.content.size_ = 0xe;
    needle_02.content.ptr = "NUL character";
    haystack_02.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_02,needle_02);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[77],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x86,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"NUL character\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [77])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"NUL character\")",
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x86,ERROR,"\"code did not throw: \" \"Path(StringPtr(\\\"foo\\\\0bar\\\", 7))\"",
               (char (*) [51])"code did not throw: Path(StringPtr(\"foo\\0bar\", 7))");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458c30;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_03.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_03.content.size_ = 0x16;
    needle_03.content.ptr = "break out of starting";
    haystack_03.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_03,needle_03);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x88,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x88,ERROR,"\"code did not throw: \" \"Path::parse(\\\"..\\\")\"",
               (char (*) [38])"code did not throw: Path::parse(\"..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458c60;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_04.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_04.content.size_ = 0x16;
    needle_04.content.ptr = "break out of starting";
    haystack_04.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_04,needle_04);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x89,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x89,ERROR,"\"code did not throw: \" \"Path::parse(\\\"../foo\\\")\"",
               (char (*) [42])"code did not throw: Path::parse(\"../foo\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458c90;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_05.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_05.content.size_ = 0x16;
    needle_05.content.ptr = "break out of starting";
    haystack_05.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_05,needle_05);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x8a,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x8a,ERROR,"\"code did not throw: \" \"Path::parse(\\\"foo/../..\\\")\"",
               (char (*) [45])"code did not throw: Path::parse(\"foo/../..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458cc0;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_06.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_06.content.size_ = 0x19;
    needle_06.content.ptr = "expected a relative path";
    haystack_06.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_06,needle_06);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[88],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x8b,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"expected a relative path\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [88])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"expected a relative path\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x8b,ERROR,"\"code did not throw: \" \"Path::parse(\\\"/foo\\\")\"",
               (char (*) [40])"code did not throw: Path::parse(\"/foo\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458cf0;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_07.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_07.content.size_ = 0xe;
    needle_07.content.ptr = "NUL character";
    haystack_07.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_07,needle_07);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[77],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x8d,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"NUL character\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [77])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"NUL character\")",
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x8d,ERROR,
               "\"code did not throw: \" \"Path::parse(kj::StringPtr(\\\"foo\\\\0bar\\\", 7))\"",
               (char (*) [62])"code did not throw: Path::parse(kj::StringPtr(\"foo\\0bar\", 7))");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458d20;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_08.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_08.content.size_ = 0x16;
    needle_08.content.ptr = "break out of starting";
    haystack_08.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_08,needle_08);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[58]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x90,ERROR,
               "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"../../..\\\")\""
               ,(char (*) [58])"code did not throw: Path({\"foo\", \"bar\"}).eval(\"../../..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458d50;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_09.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_09.content.size_ = 0x16;
    needle_09.content.ptr = "break out of starting";
    haystack_09.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_09,needle_09);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x92,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x92,ERROR,
               "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"../baz/../../..\\\")\""
               ,(char (*) [65])
                "code did not throw: Path({\"foo\", \"bar\"}).eval(\"../baz/../../..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458d80;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_10.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_10.content.size_ = 0x16;
    needle_10.content.ptr = "break out of starting";
    haystack_10.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_10,needle_10);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x94,ERROR,
               "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"baz/../../../..\\\")\""
               ,(char (*) [65])
                "code did not throw: Path({\"foo\", \"bar\"}).eval(\"baz/../../../..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458db0;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_11.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_11.content.size_ = 0x16;
    needle_11.content.ptr = "break out of starting";
    haystack_11.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_11,needle_11);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x96,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x96,ERROR,
               "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"/..\\\")\"",
               (char (*) [53])"code did not throw: Path({\"foo\", \"bar\"}).eval(\"/..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458de0;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_12.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_12.content.size_ = 0x16;
    needle_12.content.ptr = "break out of starting";
    haystack_12.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_12,needle_12);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x98,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [85])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x98,ERROR,
               "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"/baz/../..\\\")\""
               ,(char (*) [60])"code did not throw: Path({\"foo\", \"bar\"}).eval(\"/baz/../..\")");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458e10;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_13.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_13.content.size_ = 0x1a;
    needle_13.content.ptr = "root path has no basename";
    haystack_13.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_13,needle_13);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[89],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x9a,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"root path has no basename\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [89])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"root path has no basename\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x9a,ERROR,"\"code did not throw: \" \"Path(nullptr).basename()\"",
               (char (*) [45])"code did not throw: Path(nullptr).basename()");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  local_2e0[0]._vptr_Runnable = (_func_int **)&PTR_run_00458e40;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,local_2e0);
  local_2d0 = local_170._0_1_;
  if (local_170._0_1_ == true) {
    local_2c8.ownFile.content.ptr = (char *)local_168._0_8_;
    local_2c8.ownFile.content.size_ = local_168._8_8_;
    local_2c8.ownFile.content.disposer = (ArrayDisposer *)local_168._16_8_;
    local_168._0_8_ = (char *)0x0;
    local_168._8_8_ = 0;
    local_2c8.file = (char *)local_168._24_8_;
    local_2c8.line = local_168._32_4_;
    local_2c8.type = local_168._36_4_;
    local_2c8.description.content.ptr = (char *)local_168._40_8_;
    local_2c8.description.content.size_ = local_168._48_8_;
    local_2c8.description.content.disposer = (ArrayDisposer *)local_168._56_8_;
    local_2c8.context.ptr.disposer = (Disposer *)local_168._64_8_;
    local_168._40_8_ = (char *)0x0;
    local_168._48_8_ = 0;
    local_2c8.context.ptr.ptr = (Context *)local_168._72_8_;
    local_168._72_8_ = (Context *)0x0;
    memcpy(local_2c8.trace,
           (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value).
           trace,0x104);
    Exception::~Exception
              (&((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)local_168)->value);
  }
  if (local_2d0 == '\x01') {
    pcVar2 = local_2c8.description.content.ptr;
    if (local_2c8.description.content.size_ == 0) {
      pcVar2 = "";
    }
    haystack_14.content.size_ =
         local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
    needle_14.content.size_ = 0x18;
    needle_14.content.ptr = "root path has no parent";
    haystack_14.content.ptr = pcVar2;
    bVar1 = _::hasSubstring(haystack_14,needle_14);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      local_170 = local_2c8.description.content.ptr;
      if (local_2c8.description.content.size_ == 0) {
        local_170 = "";
      }
      local_168._0_8_ =
           local_2c8.description.content.size_ + (local_2c8.description.content.size_ == 0);
      _::Debug::log<char_const(&)[87],char_const(&)[56],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x9b,ERROR,
                 "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"root path has no parent\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                 ,(char (*) [87])
                  "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"root path has no parent\")"
                 ,(char (*) [56])"exception description didn\'t contain expected substring",
                 (StringPtr *)&local_170);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x9b,ERROR,"\"code did not throw: \" \"Path(nullptr).parent()\"",
               (char (*) [43])"code did not throw: Path(nullptr).parent()");
  }
  if (local_2d0 == '\x01') {
    Exception::~Exception(&local_2c8);
  }
  return;
}

Assistant:

TEST(Async, PropagateExceptionTypeChange) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  Promise<StringPtr> promise2 = promise.then([](int i) -> StringPtr { return "foo"; });

  promise2 = promise2.then(
      [](StringPtr s) -> StringPtr { return "bar"; },
      [&](Exception&& e) -> StringPtr { EXPECT_EQ(line, e.getLine()); return "baz"; });

  EXPECT_EQ("baz", promise2.wait(waitScope));
}